

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lyb.c
# Opt level: O0

ly_bool lyb_has_schema_model(lysc_node *node,lys_module **models)

{
  lys_module *local_38;
  lys_module *local_28;
  uint64_t u;
  lys_module **models_local;
  lysc_node *node_local;
  
  local_28 = (lys_module *)0x0;
  while( true ) {
    if (models == (lys_module **)0x0) {
      local_38 = (lys_module *)0x0;
    }
    else {
      local_38 = models[-1];
    }
    if (local_38 <= local_28) break;
    if (node->module == models[(long)local_28]) {
      return '\x01';
    }
    local_28 = (lys_module *)((long)&local_28->ctx + 1);
  }
  return '\0';
}

Assistant:

ly_bool
lyb_has_schema_model(const struct lysc_node *node, const struct lys_module **models)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(models, u) {
        if (node->module == models[u]) {
            return 1;
        }
    }

    return 0;
}